

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_encoder_optimum_fast.c
# Opt level: O1

void lzma_lzma_optimum_fast
               (lzma_coder_conflict9 *coder,lzma_mf *mf,uint32_t *back_res,uint32_t *len_res)

{
  short sVar1;
  uint8_t *puVar2;
  long lVar3;
  long lVar4;
  lzma_mf *plVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint uVar8;
  undefined4 extraout_var;
  ulong uVar9;
  uint32_t *puVar10;
  uint uVar11;
  ulong uVar12;
  uint8_t *puVar13;
  lzma_coder_conflict9 *plVar14;
  long lVar15;
  long lVar16;
  uint uVar17;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  bool bVar24;
  uint32_t matches_count;
  uint32_t local_8c;
  uint32_t *local_88;
  lzma_mf *local_80;
  uint32_t local_74;
  lzma_coder_conflict9 *local_70;
  uint8_t *local_68;
  uint local_60;
  uint local_5c;
  uint8_t *local_58;
  ulong local_50;
  ulong local_48;
  uint32_t *local_40;
  ulong local_38;
  
  local_74 = mf->nice_len;
  local_88 = back_res;
  local_70 = coder;
  if (mf->read_ahead == 1) {
    local_8c = coder->matches_count;
    local_48 = (ulong)coder->longest_match_length;
  }
  else {
    if (mf->read_ahead != 0) {
      __assert_fail("mf->read_ahead == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_encoder_optimum_fast.c"
                    ,0x26,
                    "void lzma_lzma_optimum_fast(lzma_coder *restrict, lzma_mf *restrict, uint32_t *restrict, uint32_t *restrict)"
                   );
    }
    uVar6 = lzma_mf_find(mf,&local_8c,coder->matches);
    local_48 = CONCAT44(extraout_var,uVar6);
  }
  uVar9 = (ulong)mf->read_pos;
  local_60 = (mf->write_pos - mf->read_pos) + 1;
  if (local_60 < 2) goto LAB_004abc1a;
  puVar2 = mf->buffer;
  puVar13 = puVar2 + uVar9;
  uVar8 = 0x111;
  if (local_60 < 0x111) {
    uVar8 = local_60;
  }
  uVar21 = 3;
  if (3 < uVar8) {
    uVar21 = (ulong)uVar8;
  }
  uVar12 = 0;
  uVar19 = 0;
  uVar20 = 0;
  plVar14 = local_70;
  uVar6 = local_74;
  local_80 = mf;
  local_68 = puVar13;
  local_58 = puVar2;
  local_50 = uVar9;
  local_40 = len_res;
  uVar8 = local_60;
  do {
    plVar5 = local_80;
    bVar24 = false;
    if (*(short *)(puVar13 + -1) == *(short *)(puVar13 + (-2 - (ulong)plVar14->reps[uVar12]))) {
      uVar23 = 2;
      if (uVar8 != 2) {
        uVar22 = 2;
        do {
          uVar23 = uVar22;
          if (puVar2[uVar22 + (uVar9 - 1)] != puVar13[uVar22 + (-2 - (ulong)plVar14->reps[uVar12])])
          break;
          uVar22 = uVar22 + 1;
          uVar23 = uVar21;
        } while (uVar21 != uVar22);
      }
      uVar11 = (uint)uVar23;
      if (uVar11 < uVar6) {
        if ((uint)uVar19 < uVar11) {
          uVar20 = uVar12 & 0xffffffff;
          uVar19 = uVar23;
        }
        bVar24 = false;
        uVar19 = uVar19 & 0xffffffff;
      }
      else {
        *local_88 = (uint32_t)uVar12;
        *len_res = uVar11;
        bVar24 = true;
        uVar7 = uVar11 - 1;
        if (uVar7 != 0) {
          local_5c = (uint)uVar20;
          local_38 = uVar19;
          (*local_80->skip)(local_80,uVar7);
          uVar20 = (ulong)local_5c;
          plVar5->read_ahead = plVar5->read_ahead + uVar7;
          puVar13 = local_68;
          plVar14 = local_70;
          uVar19 = local_38;
          len_res = local_40;
          uVar6 = local_74;
          uVar8 = local_60;
        }
      }
    }
    if (bVar24) {
      return;
    }
    uVar12 = uVar12 + 1;
  } while (uVar12 != 4);
  uVar11 = (uint)local_48;
  plVar5 = local_80;
  if (uVar11 < uVar6) {
    uVar6 = 0;
    if (1 < uVar11) {
      uVar9 = (ulong)local_8c;
      uVar6 = plVar14->matches[local_8c - 1].dist;
      if (1 < uVar9) {
        puVar10 = &plVar14->matches[uVar9 - 2].dist;
        uVar21 = local_48;
        do {
          uVar17 = ((lzma_match *)(puVar10 + -1))->len;
          uVar11 = (uint)uVar21;
          if ((uVar11 != uVar17 + 1) || (uVar6 >> 7 <= *puVar10)) break;
          local_8c = (int)uVar9 - 1;
          uVar9 = (ulong)local_8c;
          uVar6 = *puVar10;
          puVar10 = puVar10 + -2;
          uVar21 = (ulong)uVar17;
          uVar11 = uVar17;
        } while (1 < local_8c);
      }
      uVar17 = 1;
      if (uVar6 < 0x80) {
        uVar17 = uVar11;
      }
      if (uVar11 == 2) {
        uVar11 = uVar17;
      }
    }
    uVar17 = (uint)uVar19;
    if ((uVar17 < 2) ||
       (((uVar17 + 1 < uVar11 && ((uVar17 + 2 < uVar11 || (uVar6 < 0x201)))) &&
        ((uVar17 + 3 < uVar11 || (uVar6 < 0x8001)))))) {
      if ((uVar8 == 2) || (uVar11 < 2)) goto LAB_004abc1a;
      uVar7 = lzma_mf_find(local_80,&plVar14->matches_count,plVar14->matches);
      local_70->longest_match_length = uVar7;
      if (1 < uVar7) {
        uVar8 = plVar14->matches[plVar14->matches_count - 1].dist;
        if ((uVar11 <= uVar7) && (uVar8 < uVar6)) {
LAB_004abc1a:
          *local_88 = 0xffffffff;
          *len_res = 1;
          return;
        }
        if (((uVar11 + 1 < uVar7) || (uVar7 == uVar11 + 1 && uVar8 >> 7 <= uVar6)) ||
           (((2 < uVar11 && (uVar11 <= uVar7 + 1)) && (uVar8 < uVar6 >> 7)))) goto LAB_004abc1a;
      }
      uVar8 = uVar11 - 1;
      sVar1 = *(short *)(local_58 + local_50);
      lVar15 = 0;
      do {
        iVar18 = 0xc;
        if (sVar1 == *(short *)(local_68 + ~(ulong)local_70->reps[lVar15])) {
          if (2 < uVar8) {
            lVar16 = -(ulong)local_70->reps[lVar15];
            bVar24 = 2 < uVar8;
            if (local_68[2] == local_68[lVar16 + 1]) {
              uVar9 = 2;
              do {
                if ((3 - (ulong)uVar8) + uVar9 == 2) goto LAB_004abf89;
                lVar4 = uVar9 + 1;
                uVar21 = uVar9 + 1;
                lVar3 = uVar9 + lVar16;
                uVar9 = uVar21;
              } while (local_68[lVar4] == local_68[lVar3]);
              bVar24 = uVar21 < uVar8;
            }
            iVar18 = 0;
            if (bVar24) goto LAB_004abfa2;
          }
LAB_004abf89:
          *local_88 = 0xffffffff;
          *len_res = 1;
          iVar18 = 1;
        }
LAB_004abfa2:
        if ((iVar18 != 0xc) && (iVar18 != 0)) {
          return;
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 != 4);
      *local_88 = uVar6 + 4;
      *len_res = uVar11;
      uVar6 = uVar11 - 2;
      plVar5 = local_80;
    }
    else {
      *local_88 = (uint32_t)uVar20;
      *len_res = uVar17;
      uVar6 = uVar17 - 1;
    }
  }
  else {
    *local_88 = plVar14->matches[local_8c - 1].dist + 4;
    *len_res = uVar11;
    uVar6 = uVar11 - 1;
  }
  if (uVar6 != 0) {
    local_80 = plVar5;
    (*plVar5->skip)(plVar5,uVar6);
    plVar5->read_ahead = plVar5->read_ahead + uVar6;
  }
  return;
}

Assistant:

extern void
lzma_lzma_optimum_fast(lzma_coder *LZMA_RESTRICT coder, lzma_mf *LZMA_RESTRICT mf,
		uint32_t *LZMA_RESTRICT back_res, uint32_t *LZMA_RESTRICT len_res)
{
	const uint8_t *buf;
	uint32_t buf_avail;
	uint32_t i;
	uint32_t rep_len = 0;
	uint32_t rep_index = 0;
	uint32_t back_main = 0;
	uint32_t limit;

	const uint32_t nice_len = mf->nice_len;

	uint32_t len_main;
	uint32_t matches_count;
	if (mf->read_ahead == 0) {
		len_main = mf_find(mf, &matches_count, coder->matches);
	} else {
		assert(mf->read_ahead == 1);
		len_main = coder->longest_match_length;
		matches_count = coder->matches_count;
	}

	buf = mf_ptr(mf) - 1;
	buf_avail = my_min(mf_avail(mf) + 1, MATCH_LEN_MAX);

	if (buf_avail < 2) {
		// There's not enough input left to encode a match.
		*back_res = UINT32_MAX;
		*len_res = 1;
		return;
	}

	// Look for repeated matches; scan the previous four match distances
	for (i = 0; i < REP_DISTANCES; ++i) {
		uint32_t len;

		// Pointer to the beginning of the match candidate
		const uint8_t *const buf_back = buf - coder->reps[i] - 1;

		// If the first two bytes (2 == MATCH_LEN_MIN) do not match,
		// this rep is not useful.
		if (not_equal_16(buf, buf_back))
			continue;

		// The first two bytes matched.
		// Calculate the length of the match.
		for (len = 2; len < buf_avail
				&& buf[len] == buf_back[len]; ++len) ;

		// If we have found a repeated match that is at least
		// nice_len long, return it immediately.
		if (len >= nice_len) {
			*back_res = i;
			*len_res = len;
			mf_skip(mf, len - 1);
			return;
		}

		if (len > rep_len) {
			rep_index = i;
			rep_len = len;
		}
	}

	// We didn't find a long enough repeated match. Encode it as a normal
	// match if the match length is at least nice_len.
	if (len_main >= nice_len) {
		*back_res = coder->matches[matches_count - 1].dist
				+ REP_DISTANCES;
		*len_res = len_main;
		mf_skip(mf, len_main - 1);
		return;
	}

	if (len_main >= 2) {
		back_main = coder->matches[matches_count - 1].dist;

		while (matches_count > 1 && len_main ==
				coder->matches[matches_count - 2].len + 1) {
			if (!change_pair(coder->matches[
						matches_count - 2].dist,
					back_main))
				break;

			--matches_count;
			len_main = coder->matches[matches_count - 1].len;
			back_main = coder->matches[matches_count - 1].dist;
		}

		if (len_main == 2 && back_main >= 0x80)
			len_main = 1;
	}

	if (rep_len >= 2) {
		if (rep_len + 1 >= len_main
				|| (rep_len + 2 >= len_main
					&& back_main > (UINT32_C(1) << 9))
				|| (rep_len + 3 >= len_main
					&& back_main > (UINT32_C(1) << 15))) {
			*back_res = rep_index;
			*len_res = rep_len;
			mf_skip(mf, rep_len - 1);
			return;
		}
	}

	if (len_main < 2 || buf_avail <= 2) {
		*back_res = UINT32_MAX;
		*len_res = 1;
		return;
	}

	// Get the matches for the next byte. If we find a better match,
	// the current byte is encoded as a literal.
	coder->longest_match_length = mf_find(mf,
			&coder->matches_count, coder->matches);

	if (coder->longest_match_length >= 2) {
		const uint32_t new_dist = coder->matches[
				coder->matches_count - 1].dist;

		if ((coder->longest_match_length >= len_main
					&& new_dist < back_main)
				|| (coder->longest_match_length == len_main + 1
					&& !change_pair(back_main, new_dist))
				|| (coder->longest_match_length > len_main + 1)
				|| (coder->longest_match_length + 1 >= len_main
					&& len_main >= 3
					&& change_pair(new_dist, back_main))) {
			*back_res = UINT32_MAX;
			*len_res = 1;
			return;
		}
	}

	// In contrast to LZMA SDK, dictionary could not have been moved
	// between mf_find() calls, thus it is safe to just increment
	// the old buf pointer instead of recalculating it with mf_ptr().
	++buf;

	limit = len_main - 1;

	for (i = 0; i < REP_DISTANCES; ++i) {
		uint32_t len;

		const uint8_t *const buf_back = buf - coder->reps[i] - 1;

		if (not_equal_16(buf, buf_back))
			continue;

		for (len = 2; len < limit
				&& buf[len] == buf_back[len]; ++len) ;

		if (len >= limit) {
			*back_res = UINT32_MAX;
			*len_res = 1;
			return;
		}
	}

	*back_res = back_main + REP_DISTANCES;
	*len_res = len_main;
	mf_skip(mf, len_main - 2);
	return;
}